

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.hpp
# Opt level: O1

double * __thiscall
openjij::graph::Polynomial<double>::
J<int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int,int>
          (Polynomial<double> *this,int args,int args_1,int args_2,int args_3,int args_4,int args_5,
          int args_6,int args_7,int args_8,int args_9,int args_10,int args_11,int args_12,
          int args_13,int args_14,int args_15,int args_16,int args_17,int args_18,int args_19,
          int args_20,int args_21,int args_22,int args_23,int args_24,int args_25,int args_26,
          int args_27,int args_28)

{
  double *pdVar1;
  initializer_list<unsigned_long> __l;
  allocator_type local_111;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  unsigned_long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_f8 = (unsigned_long)args;
  local_f0 = (long)args_1;
  local_e8 = (long)args_2;
  local_e0 = (long)args_3;
  local_d8 = (long)args_4;
  local_d0 = (long)args_5;
  local_c8 = (long)args_6;
  local_c0 = (long)args_7;
  local_b8 = (long)args_8;
  local_b0 = (long)args_9;
  local_a8 = (long)args_10;
  local_a0 = (long)args_11;
  local_98 = (long)args_12;
  local_90 = (long)args_13;
  local_88 = (long)args_14;
  local_80 = (long)args_15;
  local_78 = (long)args_16;
  local_70 = (long)args_17;
  local_68 = (long)args_18;
  local_60 = (long)args_19;
  local_58 = (long)args_20;
  local_50 = (long)args_21;
  local_48 = (long)args_22;
  local_40 = (long)args_23;
  local_38 = (long)args_24;
  local_30 = (long)args_25;
  local_28 = (long)args_26;
  local_20 = (long)args_27;
  local_18 = (long)args_28;
  __l._M_len = 0x1d;
  __l._M_array = &local_f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_110,__l,&local_111);
  pdVar1 = J(this,&local_110);
  if (local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pdVar1;
}

Assistant:

FloatType &J(Args... args) {
    std::vector<Index> copied_key{(Index)args...};
    return J(copied_key);
  }